

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O3

void __thiscall
icu_63::TransliteratorRegistry::registerSTV
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant)

{
  short sVar1;
  int iVar2;
  int8_t iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *value;
  UnicodeString *pUVar6;
  int32_t iVar7;
  UHashtable *pUVar8;
  size_t size;
  code *size_00;
  UErrorCode status;
  UErrorCode local_5c;
  UnicodeString *local_58;
  UChar *local_50;
  UChar *local_40;
  
  local_5c = U_ZERO_ERROR;
  value = (undefined8 *)uhash_get_63((this->specDAG).hash,source);
  if (value == (undefined8 *)0x0) {
    sVar1 = (source->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (source->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    size = 0;
    iVar3 = icu_63::UnicodeString::doCompare(source,0,iVar7,L"Any",0,3);
    local_40 = L"Any";
    local_58 = target;
    if (iVar3 == '\0') {
      iVar7 = 0x7d;
    }
    else {
      sVar1 = (source->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar7 = (source->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar1 >> 5;
      }
      size = 0;
      iVar3 = icu_63::UnicodeString::doCompare(source,0,iVar7,L"Lat",0,3);
      local_50 = L"Lat";
      iVar7 = 3;
      if (iVar3 == '\0') {
        iVar7 = 0x17;
      }
    }
    value = (undefined8 *)UMemory::operator_new((UMemory *)0x58,size);
    if (value == (undefined8 *)0x0) {
      return;
    }
    *value = 0;
    if (U_ZERO_ERROR < local_5c) {
      return;
    }
    pUVar8 = (UHashtable *)(value + 1);
    uhash_initSize_63(pUVar8,uhash_hashCaselessUnicodeString_63,
                      uhash_compareCaselessUnicodeString_63,(undefined1 *)0x0,iVar7,&local_5c);
    if (U_ZERO_ERROR < local_5c) {
      return;
    }
    *value = pUVar8;
    size_00 = uprv_deleteUObject_63;
    uhash_setKeyDeleter_63(pUVar8,uprv_deleteUObject_63);
    if (U_ZERO_ERROR < local_5c) {
      return;
    }
    pUVar8 = (this->specDAG).hash;
    pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size_00);
    if (pUVar6 != (UnicodeString *)0x0) {
      icu_63::UnicodeString::UnicodeString(pUVar6,source);
    }
    uhash_put_63(pUVar8,pUVar6,value,&local_5c);
    target = local_58;
  }
  pUVar6 = variant;
  uVar4 = UVector::indexOf(&this->variantList,variant,0);
  if ((int)uVar4 < 0) {
    if (0x1e < (this->variantList).count) {
      return;
    }
    pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
    if (pUVar6 == (UnicodeString *)0x0) {
      return;
    }
    icu_63::UnicodeString::UnicodeString(pUVar6,variant);
    UVector::addElement(&this->variantList,pUVar6,&local_5c);
    if (U_ZERO_ERROR < local_5c) {
      return;
    }
    iVar2 = (this->variantList).count;
    if (iVar2 < 1) {
      return;
    }
    uVar4 = iVar2 - 1;
  }
  pUVar6 = target;
  uVar5 = uhash_geti_63((UHashtable *)*value,target);
  pUVar8 = (UHashtable *)*value;
  pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
  if (pUVar6 != (UnicodeString *)0x0) {
    icu_63::UnicodeString::UnicodeString(pUVar6,target);
  }
  uhash_puti_63(pUVar8,pUVar6,uVar5 | 1 << (uVar4 & 0x1f),&local_5c);
  return;
}

Assistant:

void TransliteratorRegistry::registerSTV(const UnicodeString& source,
                                         const UnicodeString& target,
                                         const UnicodeString& variant) {
    // assert(source.length() > 0);
    // assert(target.length() > 0);
    UErrorCode status = U_ZERO_ERROR;
    Hashtable *targets = (Hashtable*) specDAG.get(source);
    if (targets == 0) {
        int32_t size = 3;
        if (source.compare(ANY,3) == 0) {
            size = ANY_TARGETS_INIT_SIZE;
        } else if (source.compare(LAT,3) == 0) {
            size = LAT_TARGETS_INIT_SIZE;
        }
        targets = new Hashtable(TRUE, size, status);
        if (U_FAILURE(status) || targets == NULL) {
            return;
        }
        specDAG.put(source, targets, status);
    }
    int32_t variantListIndex = variantList.indexOf((void*) &variant, 0);
    if (variantListIndex < 0) {
        if (variantList.size() >= VARIANT_LIST_MAX_SIZE) {
            // can't handle any more variants
            return;
        }
        UnicodeString *variantEntry = new UnicodeString(variant);
        if (variantEntry != NULL) {
            variantList.addElement(variantEntry, status);
            if (U_SUCCESS(status)) {
                variantListIndex = variantList.size() - 1;
            }
        }
        if (variantListIndex < 0) {
            return;
        }
    }
    uint32_t addMask = 1 << variantListIndex;
    uint32_t varMask = targets->geti(target);
    targets->puti(target, varMask | addMask, status);
}